

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckRows(TidyDocImpl *doc,Node *node)

{
  int *piVar1;
  char cVar2;
  Node *pNVar3;
  Bool BVar4;
  ctmbstr ptVar5;
  uint uVar6;
  uint uVar7;
  ctmbstr cp;
  
  piVar1 = &(doc->access).CheckedHeaders;
  *piVar1 = *piVar1 + 1;
  if (node == (Node *)0x0) {
    uVar7 = 0;
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    do {
      pNVar3 = node->content;
      if (((pNVar3 != (Node *)0x0) && (pNVar3->tag != (Dict *)0x0)) &&
         (pNVar3->tag->id == TidyTag_TH)) {
        (doc->access).HasTH = yes;
        BVar4 = prvTidynodeIsText(pNVar3->content);
        if (BVar4 != no) {
          ptVar5 = textFromOneNode(doc,node->content->content);
          do {
            cVar2 = *ptVar5;
            if (cVar2 == '\0') break;
            BVar4 = prvTidyIsWhite((int)cVar2);
            ptVar5 = ptVar5 + 1;
          } while (BVar4 != no);
          uVar6 = (uVar6 + 1) - (uint)(cVar2 == '\0');
        }
      }
      uVar7 = uVar7 + 1;
      node = node->next;
    } while (node != (Node *)0x0);
  }
  if (uVar7 == uVar6) {
    (doc->access).HasValidRowHeaders = yes;
  }
  if (((1 < uVar7) && (1 < (int)uVar6 && (int)uVar6 < (int)uVar7)) && ((doc->access).HasTH == yes))
  {
    (doc->access).HasInvalidRowHeader = yes;
  }
  return;
}

Assistant:

static void CheckRows( TidyDocImpl* doc, Node* node )
{
    int numTR = 0;
    int numValidTH = 0;
    
    doc->access.CheckedHeaders++;

    for (; node != NULL; node = node->next )
    {
        numTR++;
        if ( nodeIsTH(node->content) )
        {
            doc->access.HasTH = yes;            
            if ( TY_(nodeIsText)(node->content->content) )
            {
                ctmbstr word = textFromOneNode( doc, node->content->content);
                if ( !IsWhitespace(word) )
                    numValidTH++;
            }
        }
    }

    if (numTR == numValidTH)
        doc->access.HasValidRowHeaders = yes;

    if ( numTR >= 2 &&
         numTR > numValidTH &&
         numValidTH >= 2 &&
         doc->access.HasTH == yes )
        doc->access.HasInvalidRowHeader = yes;
}